

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_iflist.c
# Opt level: O2

void csp_iflist_add(csp_iface_t *ifc)

{
  char *__s1;
  int iVar1;
  csp_iface_t *pcVar2;
  csp_iface_t **ppcVar3;
  csp_iface_t *i;
  csp_iface_t *pcVar4;
  
  if ((ifc != (csp_iface_t *)0x0) && (__s1 = ifc->name, __s1 != (char *)0x0)) {
    ifc->next = (csp_iface_s *)0x0;
    if (interfaces == (csp_iface_t *)0x0) {
      ppcVar3 = &interfaces;
    }
    else {
      pcVar2 = (csp_iface_t *)0x0;
      for (pcVar4 = interfaces; pcVar4 != (csp_iface_t *)0x0; pcVar4 = pcVar4->next) {
        if (pcVar4 == ifc) {
          return;
        }
        iVar1 = strncmp(__s1,pcVar4->name,10);
        if (iVar1 == 0) {
          return;
        }
        pcVar2 = pcVar4;
      }
      ppcVar3 = &pcVar2->next;
    }
    *ppcVar3 = ifc;
  }
  return;
}

Assistant:

void csp_iflist_add(csp_iface_t * ifc) {

	if ((ifc == NULL) || (ifc->name == NULL)) {
		return;
	}

	ifc->next = NULL;

	/* Add interface to pool */
	if (interfaces == NULL) {
		/* This is the first interface to be added */
		interfaces = ifc;
	} else {
		/* Insert interface last if not already in pool */
		csp_iface_t * last = NULL;
		for (csp_iface_t * i = interfaces; i != NULL; i = i->next) {
			if ((i == ifc) || (strncmp(ifc->name, i->name, CSP_IFLIST_NAME_MAX) == 0)) {
				return;
			}
			last = i;
		}

		last->next = ifc;
	}

}